

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

void spawn_stdin_stdout(void)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int *piVar4;
  char *__s;
  undefined8 uVar5;
  char *pcVar6;
  undefined1 *unaff_R15;
  undefined1 *__buf;
  int64_t eval_b;
  int64_t eval_a;
  char buf [1024];
  long lStack_458;
  undefined1 *puStack_450;
  size_t sStack_448;
  code *pcStack_440;
  undefined8 local_438;
  size_t local_430;
  undefined1 local_428 [1032];
  
LAB_001c4531:
  pcStack_440 = (code *)0x1c4540;
  sVar2 = read(0,local_428,0x400);
  if (sVar2 == 0xffffffffffffffff) goto LAB_001c4550;
  if (sVar2 == 0) {
    return;
  }
  goto LAB_001c455a;
LAB_001c4550:
  pcStack_440 = (code *)0x1c4555;
  piVar4 = __errno_location();
  if (*piVar4 != 4) {
LAB_001c455a:
    local_438 = 0;
    __buf = local_428;
    local_430 = sVar2;
    if ((long)sVar2 < 1) goto LAB_001c45d9;
LAB_001c4575:
    do {
      pcStack_440 = (code *)0x1c4585;
      sVar3 = write(1,__buf,sVar2);
      if (sVar3 == 0xffffffffffffffff) {
        pcStack_440 = (code *)0x1c4593;
        piVar4 = __errno_location();
        if (*piVar4 == 4) goto LAB_001c4575;
      }
      local_438 = 0;
      local_430 = sVar3;
      if ((long)sVar3 < 0) {
        pcStack_440 = (code *)0x1c45d9;
        spawn_stdin_stdout_cold_2();
        unaff_R15 = __buf;
        goto LAB_001c45d9;
      }
      unaff_R15 = __buf + sVar3;
      sVar2 = sVar2 - sVar3;
      __buf = unaff_R15;
    } while (sVar2 != 0);
  }
  goto LAB_001c4531;
LAB_001c45d9:
  pcStack_440 = run_test_spawn_relative_path;
  spawn_stdin_stdout_cold_1();
  puStack_450 = local_428;
  sStack_448 = sVar2;
  pcStack_440 = (code *)unaff_R15;
  init_process_options("spawn_helper1",exit_cb);
  exepath_size = 0x3fe;
  iVar1 = uv_exepath(exepath,&exepath_size);
  lStack_458 = (long)iVar1;
  if (lStack_458 == 0) {
    exepath[exepath_size] = '\0';
    __s = strrchr(exepath,0x2f);
    if (__s == (char *)0x0) {
      pcVar6 = exepath;
      __s = strrchr(exepath,0x5c);
      if (__s == (char *)0x0) goto LAB_001c4814;
    }
    sVar2 = strlen(__s);
    memmove(__s + 2,__s,sVar2 + 1);
    __s[0] = '\0';
    __s[1] = '.';
    __s[2] = '/';
    options.file = __s + 1;
    options.cwd = exepath;
    *options.args = options.file;
    uVar5 = uv_default_loop();
    iVar1 = uv_spawn(uVar5,&process,&options);
    lStack_458 = (long)iVar1;
    if (lStack_458 != 0) goto LAB_001c47d3;
    uVar5 = uv_default_loop();
    iVar1 = uv_run(uVar5,0);
    lStack_458 = (long)iVar1;
    if (lStack_458 != 0) goto LAB_001c47e0;
    lStack_458 = 1;
    if (exit_cb_called != 1) goto LAB_001c47ed;
    lStack_458 = 1;
    if (close_cb_called != 1) goto LAB_001c47fa;
    uVar5 = uv_default_loop();
    uv_walk(uVar5,close_walk_cb,0);
    uv_run(uVar5,0);
    lStack_458 = 0;
    uVar5 = uv_default_loop();
    iVar1 = uv_loop_close(uVar5);
    if (lStack_458 == iVar1) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_spawn_relative_path_cold_1();
LAB_001c47d3:
    run_test_spawn_relative_path_cold_2();
LAB_001c47e0:
    run_test_spawn_relative_path_cold_3();
LAB_001c47ed:
    run_test_spawn_relative_path_cold_4();
LAB_001c47fa:
    run_test_spawn_relative_path_cold_5();
  }
  pcVar6 = (char *)&lStack_458;
  run_test_spawn_relative_path_cold_6();
LAB_001c4814:
  run_test_spawn_relative_path_cold_7();
  iVar1 = uv_is_closing();
  if (iVar1 == 0) {
    uv_close(pcVar6,0);
    return;
  }
  return;
}

Assistant:

void spawn_stdin_stdout(void) {
  char buf[1024];
  char* pbuf;
  for (;;) {
    ssize_t r, w, c;
    do {
      r = read(0, buf, sizeof buf);
    } while (r == -1 && errno == EINTR);
    if (r == 0) {
      return;
    }
    ASSERT_GT(r, 0);
    c = r;
    pbuf = buf;
    while (c) {
      do {
        w = write(1, pbuf, (size_t)c);
      } while (w == -1 && errno == EINTR);
      ASSERT_GE(w, 0);
      pbuf = pbuf + w;
      c = c - w;
    }
  }
}